

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O3

string * __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>>
::getStorageFilePath_abi_cxx11_
          (string *__return_storage_ptr__,
          SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>>
          *this)

{
  long *plVar1;
  long lVar2;
  
  plVar1 = *(long **)(this + 0x20);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar2 = *plVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar2,plVar1[1] + lVar2);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string getStorageFilePath() const noexcept {
        return storageFile_->getPath();
    }